

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall embree::SceneGraph::TransformNode::calculateInDegree(TransformNode *this)

{
  long in_RDI;
  
  *(long *)(in_RDI + 0x50) = *(long *)(in_RDI + 0x50) + 1;
  if ((*(long *)(in_RDI + 0x50) == 1) &&
     ((**(code **)(**(long **)(in_RDI + 0x98) + 0x30))(), 1 < *(ulong *)(in_RDI + 0x78))) {
    (**(code **)(**(long **)(in_RDI + 0x98) + 0x30))();
  }
  return;
}

Assistant:

void SceneGraph::TransformNode::calculateInDegree()
  {
    indegree++;
    if (indegree == 1) {
      child->calculateInDegree();
      if (spaces.size() > 1) child->calculateInDegree(); // break instance up when motion blur is used
    }
  }